

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setMaximumTime(QDateTimeEdit *this,QTime max)

{
  QDate date;
  char cVar1;
  QTime time;
  long in_FS_OFFSET;
  QTime local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  date.jd = *(qint64 *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_24.mds = max.mds;
  cVar1 = QTime::isValid();
  if (cVar1 != '\0') {
    time.mds = ::QVariant::toDate();
    QDateTimeEditPrivate::dateTimeValue((QDateTimeEditPrivate *)&stack0xffffffffffffffd0,date,time);
    setMaximumDateTime(this,(QDateTime *)&stack0xffffffffffffffd0);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setMaximumTime(QTime max)
{
    Q_D(QDateTimeEdit);
    if (max.isValid())
        setMaximumDateTime(d->dateTimeValue(d->maximum.toDate(), max));
}